

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O0

void __thiscall QFusionStylePrivate::QFusionStylePrivate(QFusionStylePrivate *this)

{
  QCommonStylePrivate *in_RDI;
  
  QCommonStylePrivate::QCommonStylePrivate(in_RDI);
  *(undefined ***)&in_RDI->super_QStylePrivate = &PTR__QFusionStylePrivate_00d0e3c8;
  in_RDI->animationFps = 0x3c;
  return;
}

Assistant:

QFusionStylePrivate::QFusionStylePrivate()
{
    animationFps = 60;
}